

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  allocator<char> local_49a;
  allocator_type local_499;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  InMemoryConnector inMemoryConnector;
  CppHttpLibClientConnector httpClient;
  WarehouseServer app;
  MethodHandle local_410;
  MethodHandle local_3f0;
  MethodHandle local_3d0;
  JsonRpc2Server rpcServer;
  CppHttpLibServerConnector httpServer;
  
  jsonrpccxx::JsonRpc2Server::JsonRpc2Server(&rpcServer);
  app.products._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &app.products._M_t._M_impl.super__Rb_tree_header._M_header;
  app.products._M_t._M_impl._0_8_ = 0;
  app.products._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  app.products._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  app.products._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  app.products._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  app.products._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       app.products._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&httpServer,"GetProduct",(allocator<char> *)&httpClient);
  jsonrpccxx::GetHandle<WarehouseServer,Product_const&,std::__cxx11::string_const&>
            (&local_3d0,(jsonrpccxx *)WarehouseServer::GetProduct,0,&app);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_498,"id",&local_49a);
  __l._M_len = 1;
  __l._M_array = &local_498;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&inMemoryConnector,__l,&local_499);
  jsonrpccxx::JsonRpcServer::Add
            (&rpcServer.super_JsonRpcServer,(string *)&httpServer,&local_3d0,
             (NamedParamMapping *)&inMemoryConnector);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&inMemoryConnector);
  std::__cxx11::string::~string((string *)&local_498);
  std::_Function_base::~_Function_base(&local_3d0.super__Function_base);
  std::__cxx11::string::~string((string *)&httpServer);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&httpServer,"AddProduct",(allocator<char> *)&httpClient);
  jsonrpccxx::GetHandle<WarehouseServer,bool,Product_const&>
            (&local_3f0,(jsonrpccxx *)WarehouseServer::AddProduct,0,&app);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_498,"product",&local_49a);
  __l_00._M_len = 1;
  __l_00._M_array = &local_498;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&inMemoryConnector,__l_00,&local_499);
  jsonrpccxx::JsonRpcServer::Add
            (&rpcServer.super_JsonRpcServer,(string *)&httpServer,&local_3f0,
             (NamedParamMapping *)&inMemoryConnector);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&inMemoryConnector);
  std::__cxx11::string::~string((string *)&local_498);
  std::_Function_base::~_Function_base(&local_3f0.super__Function_base);
  std::__cxx11::string::~string((string *)&httpServer);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&httpServer,"AllProducts",(allocator<char> *)&inMemoryConnector);
  jsonrpccxx::GetHandle<WarehouseServer,std::vector<Product,std::allocator<Product>>>
            (&local_410,(jsonrpccxx *)WarehouseServer::AllProducts,0,&app);
  local_498._M_dataplus._M_p = (pointer)0x0;
  local_498._M_string_length._0_2_ = 0;
  local_498._M_string_length._2_6_ = 0;
  local_498.field_2._M_allocated_capacity = 0;
  jsonrpccxx::JsonRpcServer::Add
            (&rpcServer.super_JsonRpcServer,(string *)&httpServer,&local_410,
             (NamedParamMapping *)&local_498);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_498);
  std::_Function_base::~_Function_base(&local_410.super__Function_base);
  std::__cxx11::string::~string((string *)&httpServer);
  poVar1 = std::operator<<((ostream *)&std::cout,"Running in-memory example");
  std::operator<<(poVar1,"\n");
  inMemoryConnector.super_IClientConnector._vptr_IClientConnector =
       (_func_int **)&PTR__IClientConnector_0016c5f0;
  inMemoryConnector.server = &rpcServer.super_JsonRpcServer;
  doWarehouseStuff(&inMemoryConnector.super_IClientConnector);
  poVar1 = std::operator<<((ostream *)&std::cout,"Running http example");
  std::operator<<(poVar1,"\n");
  CppHttpLibServerConnector::CppHttpLibServerConnector
            (&httpServer,&rpcServer.super_JsonRpcServer,0x2124);
  poVar1 = std::operator<<((ostream *)&std::cout,"Starting http server: ");
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) | 1;
  CppHttpLibServerConnector::StartListening(&httpServer);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_498,"localhost",&local_49a);
  CppHttpLibClientConnector::CppHttpLibClientConnector(&httpClient,&local_498,0x2124);
  std::__cxx11::string::~string((string *)&local_498);
  local_498._M_dataplus._M_p = SUB108((longdouble)0.5,0);
  local_498._M_string_length._0_2_ = (undefined2)((unkuint10)(longdouble)0.5 >> 0x40);
  std::this_thread::sleep_for<long_double,std::ratio<1l,1l>>
            ((duration<long_double,_std::ratio<1L,_1L>_> *)&local_498);
  doWarehouseStuff(&httpClient.super_IClientConnector);
  CppHttpLibClientConnector::~CppHttpLibClientConnector(&httpClient);
  CppHttpLibServerConnector::~CppHttpLibServerConnector(&httpServer);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Product>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Product>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Product>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Product>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Product>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Product>_>_>
               *)&app);
  jsonrpccxx::JsonRpcServer::~JsonRpcServer(&rpcServer.super_JsonRpcServer);
  return 0;
}

Assistant:

int main() {
  JsonRpc2Server rpcServer;

  // Bindings
  WarehouseServer app;
  rpcServer.Add("GetProduct", GetHandle(&WarehouseServer::GetProduct, app), {"id"});
  rpcServer.Add("AddProduct", GetHandle(&WarehouseServer::AddProduct, app), {"product"});
  rpcServer.Add("AllProducts", GetHandle(&WarehouseServer::AllProducts, app), {});

  cout << "Running in-memory example" << "\n";
  InMemoryConnector inMemoryConnector(rpcServer);
  doWarehouseStuff(inMemoryConnector);

  cout << "Running http example" << "\n";
  CppHttpLibServerConnector httpServer(rpcServer, 8484);
  cout << "Starting http server: " << std::boolalpha << httpServer.StartListening() << "\n";
  CppHttpLibClientConnector httpClient("localhost", 8484);
  std::this_thread::sleep_for(0.5s);
  doWarehouseStuff(httpClient);

  return 0;
}